

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeGenericType
          (Builder *this,Op opcode,
          vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *operands)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  Id IVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference ppIVar7;
  reference pvVar8;
  Instruction *pIVar9;
  Id local_84;
  value_type local_60;
  Op local_54;
  ulong local_50;
  size_t op_1;
  bool local_3d;
  int op;
  Op OStack_38;
  bool match;
  int local_34;
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *operands_local;
  Builder *pBStack_18;
  Op opcode_local;
  Builder *this_local;
  
  local_34 = 0;
  type = (Instruction *)operands;
  operands_local._4_4_ = opcode;
  pBStack_18 = this;
  do {
    iVar3 = local_34;
    OStack_38 = operands_local._4_4_;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,&stack0xffffffffffffffc8);
    sVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar5);
    if ((int)sVar6 <= iVar3) {
      pIVar9 = (Instruction *)::operator_new(0x60);
      IVar4 = getUniqueId(this);
      spv::Instruction::Instruction(pIVar9,IVar4,0,operands_local._4_4_);
      pIStack_30 = pIVar9;
      sVar6 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::size
                        ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type);
      spv::Instruction::reserveOperands(pIVar9,sVar6);
      for (local_50 = 0; uVar2 = local_50,
          sVar6 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::size
                            ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type),
          uVar2 < sVar6; local_50 = local_50 + 1) {
        pvVar8 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::operator[]
                           ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type,
                            local_50);
        pIVar9 = pIStack_30;
        if ((pvVar8->isId & 1U) == 0) {
          pvVar8 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::operator[]
                             ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type,
                              local_50);
          spv::Instruction::addImmediateOperand(pIVar9,pvVar8->word);
        }
        else {
          pvVar8 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::operator[]
                             ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type,
                              local_50);
          spv::Instruction::addIdOperand(pIVar9,pvVar8->word);
        }
      }
      local_54 = operands_local._4_4_;
      pmVar5 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,&local_54);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar5,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_60,
                 pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_60);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_60);
      Module::mapInstruction(&this->module,pIStack_30);
      IVar4 = spv::Instruction::getResultId(pIStack_30);
      return IVar4;
    }
    op = operands_local._4_4_;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,(key_type *)&op);
    ppIVar7 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar5,(long)local_34);
    pIStack_30 = *ppIVar7;
    iVar3 = spv::Instruction::getNumOperands(pIStack_30);
    sVar6 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::size
                      ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type);
    if ((long)iVar3 == sVar6) {
      local_3d = true;
      op_1._4_4_ = 0;
      while( true ) {
        iVar3 = op_1._4_4_;
        bVar1 = false;
        if (local_3d != false) {
          sVar6 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::size
                            ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type);
          bVar1 = iVar3 < (int)sVar6;
        }
        if (!bVar1) break;
        pvVar8 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::operator[]
                           ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type,
                            (long)op_1._4_4_);
        if ((pvVar8->isId & 1U) == 0) {
          local_84 = spv::Instruction::getImmediateOperand(pIStack_30,op_1._4_4_);
        }
        else {
          local_84 = spv::Instruction::getIdOperand(pIStack_30,op_1._4_4_);
        }
        pvVar8 = std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::operator[]
                           ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)type,
                            (long)op_1._4_4_);
        local_3d = local_84 == pvVar8->word;
        op_1._4_4_ = op_1._4_4_ + 1;
      }
      if ((local_3d & 1U) != 0) {
        IVar4 = spv::Instruction::getResultId(pIStack_30);
        return IVar4;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Id Builder::makeGenericType(spv::Op opcode, std::vector<spv::IdImmediate>& operands)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[opcode].size(); ++t) {
        type = groupedTypes[opcode][t];
        if (static_cast<size_t>(type->getNumOperands()) != operands.size())
            continue; // Number mismatch, find next

        bool match = true;
        for (int op = 0; match && op < (int)operands.size(); ++op) {
            match = (operands[op].isId ? type->getIdOperand(op) : type->getImmediateOperand(op)) == operands[op].word;
        }
        if (match)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, opcode);
    type->reserveOperands(operands.size());
    for (size_t op = 0; op < operands.size(); ++op) {
        if (operands[op].isId)
            type->addIdOperand(operands[op].word);
        else
            type->addImmediateOperand(operands[op].word);
    }
    groupedTypes[opcode].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}